

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void * crnlib::task_pool::thread_func(void *pContext)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  task tsk;
  task_pool *pPool;
  task *in_stack_ffffffffffffffc8;
  task_pool *in_stack_ffffffffffffffd0;
  task *in_stack_ffffffffffffffd8;
  anon_union_8_2_408cf123_for_task_2 in_stack_ffffffffffffffe0;
  
  task::task((task *)&stack0xffffffffffffffd0);
  while ((uVar2 = semaphore::wait((semaphore *)(in_RDI + 0x298),(void *)0xffffffff),
         (uVar2 & 1) != 0 && (*(long *)(in_RDI + 0x2b8) == 0))) {
    bVar1 = tsstack<crnlib::task_pool::task,_16U>::pop
                      ((tsstack<crnlib::task_pool::task,_16U> *)in_stack_ffffffffffffffe0.m_pObj,
                       in_stack_ffffffffffffffd8);
    if (bVar1) {
      process_task(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return (void *)0x0;
}

Assistant:

void* task_pool::thread_func(void* pContext) {
  task_pool* pPool = static_cast<task_pool*>(pContext);
  task tsk;

  for (;;) {
    if (!pPool->m_tasks_available.wait())
      break;

    if (pPool->m_exit_flag)
      break;

    if (pPool->m_task_stack.pop(tsk)) {
      pPool->process_task(tsk);
    }
  }

  return NULL;
}